

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void __thiscall
duckdb::RLECompressState<unsigned_char,_true>::CreateEmptySegment
          (RLECompressState<unsigned_char,_true> *this,idx_t row_start)

{
  BlockManager *pBVar1;
  CompressionFunction *function;
  undefined8 uVar2;
  DatabaseInstance *db;
  LogicalType *type;
  idx_t iVar3;
  idx_t iVar4;
  BufferManager *pBVar5;
  pointer pCVar6;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> column_segment
  ;
  undefined1 local_58 [40];
  
  local_58._8_8_ = row_start;
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  pBVar1 = (this->super_CompressionState).info.block_manager;
  function = this->function;
  iVar3 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar4 = optional_idx::GetIndex(&pBVar1->block_header_size);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)local_58,db,function,type,local_58._8_8_,iVar3 - iVar4,
             (this->super_CompressionState).info.block_manager);
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (ColumnSegment *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->current_segment,(pointer)uVar2);
  pBVar5 = BufferManager::GetBufferManager(db);
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  (*pBVar5->_vptr_BufferManager[7])(local_58 + 0x10,pBVar5,&pCVar6->block);
  BufferHandle::operator=(&this->handle,(BufferHandle *)(local_58 + 0x10));
  BufferHandle::~BufferHandle((BufferHandle *)(local_58 + 0x10));
  uVar2 = local_58._0_8_;
  if ((ColumnSegment *)local_58._0_8_ != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment((ColumnSegment *)local_58._0_8_);
    operator_delete((void *)uVar2);
  }
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto column_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start, info.GetBlockSize(),
		                                                            info.GetBlockManager());
		current_segment = std::move(column_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(db);
		handle = buffer_manager.Pin(current_segment->block);
	}